

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

void __thiscall
Random_keys::cruzamento4
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  result_type __s;
  size_type sVar1;
  double *pdVar2;
  reference ppCVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong local_68;
  unsigned_long i_1;
  unsigned_long i;
  RK_Individual *piorPai;
  RK_Individual *melhorPai;
  int tamMelhor;
  int tam;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
  local_38;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
  local_30;
  RK_Individual *local_28;
  RK_Individual *filho_local;
  RK_Individual *pai2_local;
  RK_Individual *pai1_local;
  Random_keys *this_local;
  
  local_28 = filho;
  filho_local = pai2;
  pai2_local = pai1;
  pai1_local = (RK_Individual *)this;
  local_30._M_current =
       (Chromosome **)
       std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::begin(&RK_Individual::cromossomos);
  local_38._M_current =
       (Chromosome **)
       std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::end(&RK_Individual::cromossomos);
  __s = time((time_t *)0x0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&tamMelhor,__s
            );
  std::
  shuffle<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (local_30,local_38,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&tamMelhor);
  sVar1 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::size
                    (&RK_Individual::cromossomos);
  dVar4 = round((double)(int)sVar1 * 0.8);
  piorPai = filho_local;
  i = (unsigned_long)pai2_local;
  dVar5 = RK_Individual::getActiveLoss(pai2_local);
  dVar6 = RK_Individual::getActiveLoss(filho_local);
  if (dVar5 < dVar6) {
    piorPai = pai2_local;
    i = (unsigned_long)filho_local;
  }
  for (i_1 = 0; i_1 < (ulong)(long)(int)dVar4; i_1 = i_1 + 1) {
    pdVar2 = RK_Individual::getWeights(piorPai);
    ppCVar3 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,i_1);
    dVar5 = pdVar2[(*ppCVar3)->position];
    pdVar2 = RK_Individual::getWeights(local_28);
    ppCVar3 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,i_1);
    pdVar2[(*ppCVar3)->position] = dVar5;
  }
  local_68 = (ulong)(int)dVar4;
  while( true ) {
    sVar1 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::size
                      (&RK_Individual::cromossomos);
    if (sVar1 <= local_68) break;
    pdVar2 = RK_Individual::getWeights((RK_Individual *)i);
    ppCVar3 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,local_68);
    dVar4 = pdVar2[(*ppCVar3)->position];
    pdVar2 = RK_Individual::getWeights(local_28);
    ppCVar3 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,local_68);
    pdVar2[(*ppCVar3)->position] = dVar4;
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

void Random_keys::cruzamento4(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    shuffle(RK_Individual::cromossomos.begin(), RK_Individual::cromossomos.end(), std::default_random_engine(time(NULL)));

    int tam = RK_Individual::cromossomos.size();

    int tamMelhor = round(0.8*tam);

    RK_Individual *melhorPai = pai2, *piorPai = pai1;
    if(pai1->getActiveLoss()<pai2->getActiveLoss()){
        melhorPai = pai1;
        piorPai = pai2;
    }

    //80% vem do melhor pai
    for(unsigned long int i=0; i<tamMelhor; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = melhorPai->getWeights()[RK_Individual::cromossomos.at(i)->position];

    //20% vem do pior pai
    for(unsigned long int i=tamMelhor; i<RK_Individual::cromossomos.size(); i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = piorPai->getWeights()[RK_Individual::cromossomos.at(i)->position];
}